

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::E_formatter<spdlog::details::scoped_padder>::format
          (E_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  unsigned_long_long uVar1;
  char *pcVar2;
  unsigned_long_long value;
  long lVar3;
  scoped_padder p;
  char *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  char acStack_4b [3];
  char *local_48;
  scoped_padder local_40;
  
  scoped_padder::scoped_padder(&local_40,10,&(this->super_flag_formatter).padinfo_,dest);
  lVar3 = (msg->time).__d.__r;
  uVar1 = lVar3 / 1000000000;
  value = -uVar1;
  if (0 < (long)uVar1) {
    value = uVar1;
  }
  pcVar2 = fmt::v6::format_int::format_decimal((format_int *)&stack0xffffffffffffffa0,value);
  local_48 = pcVar2;
  if (lVar3 < -999999999) {
    local_48 = pcVar2 + -1;
    pcVar2[-1] = '-';
  }
  lVar3 = (long)&stack0xffffffffffffffa0 - (long)local_48;
  if (-0x16 < lVar3) {
    fmt::v6::internal::buffer<char>::append<char>
              (&dest->super_buffer<char>,local_48,local_48 + lVar3 + 0x15);
    scoped_padder::~scoped_padder(&local_40);
    return;
  }
  fmt::v6::internal::assert_fail(in_stack_ffffffffffffffa0,0,in_stack_ffffffffffffff98);
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        const size_t field_size = 10;
        ScopedPadder p(field_size, padinfo_, dest);
        auto duration = msg.time.time_since_epoch();
        auto seconds = std::chrono::duration_cast<std::chrono::seconds>(duration).count();
        fmt_helper::append_int(seconds, dest);
    }